

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O0

void __thiscall depspawn::internal::arg_info::insert_in_arglist(arg_info *this,arg_info **args)

{
  bool bVar1;
  arg_info *in_RSI;
  arg_info *in_RDI;
  arg_info *prev;
  arg_info *p;
  arg_info *local_20;
  arg_info *other;
  
  if (in_RSI->addr == 0) {
    in_RSI->addr = (value_t)in_RDI;
  }
  else if (in_RDI->addr < *(ulong *)in_RSI->addr) {
    in_RDI->next = (arg_info *)in_RSI->addr;
    in_RSI->addr = (value_t)in_RDI;
  }
  else {
    local_20 = (arg_info *)in_RSI->addr;
    for (other = *(arg_info **)(in_RSI->addr + 0x18); other != (arg_info *)0x0; other = other->next)
    {
      if (in_RDI->addr < other->addr) {
        bVar1 = is_array(in_RDI);
        if ((bVar1) || (in_RDI->addr != local_20->addr)) {
          local_20->next = in_RDI;
          in_RDI->next = other;
        }
        else {
          solve_overlap(in_RSI,other);
        }
        break;
      }
      local_20 = other;
    }
    if (other == (arg_info *)0x0) {
      bVar1 = is_array(in_RDI);
      if ((bVar1) || (in_RDI->addr != local_20->addr)) {
        local_20->next = in_RDI;
      }
      else {
        solve_overlap(in_RSI,other);
      }
    }
  }
  return;
}

Assistant:

void arg_info::insert_in_arglist(arg_info*& args)
    { arg_info *p, *prev;
      
      if(!args) {
	args = this;
      } else if(addr < args->addr) {
	next = args;
	args = this;
      } else {
	
	prev = args;
	p = args->next;
	while(p) {
	  if(addr < p->addr) {
	    if( !is_array() && (addr == prev->addr) ) //Arrays are inserted replicated
	      solve_overlap(prev);
	    else {
	      prev->next = this;
	      next = p;
	    }
	    break;
	  }
	  prev = p;
	  p = p->next;
	}
	
        if(!p) {
          if( !is_array() && (addr == prev->addr) ) { //Arrays are inserted replicated
	    solve_overlap(prev);
          } else {
	    prev->next = this;
          }
        }
      }
      
    }